

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt32 tt_cmap2_char_next(TT_CMap cmap,FT_UInt32 *pcharcode)

{
  FT_Byte *table;
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ushort *puVar8;
  uint uVar9;
  uint uVar10;
  FT_UInt32 FVar11;
  
  uVar10 = *pcharcode + 1;
  if (0xffff < uVar10) {
LAB_0023fbe6:
    FVar11 = 0;
    uVar10 = 0;
LAB_0023fbeb:
    *pcharcode = FVar11;
    return uVar10;
  }
  table = cmap->data;
LAB_0023fafe:
  puVar1 = (ushort *)tt_cmap2_get_subheader(table,uVar10);
  if (puVar1 != (ushort *)0x0) {
    uVar2 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = puVar1[1] << 8 | puVar1[1] >> 8;
    uVar9 = uVar10 & 0xff;
    if ((uVar10 < 0x100) && (uVar7 = 0x100, (uint)uVar3 + (uint)uVar2 <= uVar9)) goto LAB_0023fbd6;
    uVar4 = puVar1[3] << 8 | puVar1[3] >> 8;
    if (uVar4 != 0) {
      uVar6 = (uint)uVar2;
      uVar5 = uVar9 - uVar6;
      uVar7 = (uint)uVar2;
      if (uVar9 >= uVar6 && uVar5 != 0) {
        uVar7 = uVar9;
      }
      if (uVar9 < uVar6) {
        uVar5 = 0;
      }
      FVar11 = (uVar10 & 0xff00) + uVar7;
      if (uVar5 < uVar3) {
        puVar8 = (ushort *)((long)puVar1 + (ulong)((uint)uVar4 + uVar5 * 2) + 6);
        do {
          uVar2 = *puVar8 << 8 | *puVar8 >> 8;
          if ((uVar2 != 0) &&
             (uVar10 = (uint)uVar2 + (uint)(ushort)(puVar1[2] << 8 | puVar1[2] >> 8) & 0xffff,
             uVar10 != 0)) goto LAB_0023fbeb;
          uVar5 = uVar5 + 1;
          FVar11 = FVar11 + 1;
          puVar8 = puVar8 + 1;
        } while (uVar5 < uVar3);
      }
      uVar10 = (FVar11 - 1) + (uint)(uVar3 == 0);
      goto LAB_0023fbbe;
    }
    if (uVar10 == 0x100) goto LAB_0023fbe6;
  }
LAB_0023fbbe:
  uVar7 = (uVar10 & 0xffffff00) + 0x100;
  if (uVar10 < 0x100) {
    uVar7 = uVar10 + 1;
  }
LAB_0023fbd6:
  uVar10 = uVar7;
  if (0xffff < uVar10) goto LAB_0023fbe6;
  goto LAB_0023fafe;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap2_char_next( TT_CMap     cmap,
                      FT_UInt32  *pcharcode )
  {
    FT_Byte*   table    = cmap->data;
    FT_UInt    gindex   = 0;
    FT_UInt32  result   = 0;
    FT_UInt32  charcode = *pcharcode + 1;
    FT_Byte*   subheader;


    while ( charcode < 0x10000UL )
    {
      subheader = tt_cmap2_get_subheader( table, charcode );
      if ( subheader )
      {
        FT_Byte*  p       = subheader;
        FT_UInt   start   = TT_NEXT_USHORT( p );
        FT_UInt   count   = TT_NEXT_USHORT( p );
        FT_Int    delta   = TT_NEXT_SHORT ( p );
        FT_UInt   offset  = TT_PEEK_USHORT( p );
        FT_UInt   char_lo = (FT_UInt)( charcode & 0xFF );
        FT_UInt   pos, idx;


        if ( char_lo >= start + count && charcode <= 0xFF )
        {
          /* this happens only for a malformed cmap */
          charcode = 0x100;
          continue;
        }

        if ( offset == 0 )
        {
          if ( charcode == 0x100 )
            goto Exit; /* this happens only for a malformed cmap */
          goto Next_SubHeader;
        }

        if ( char_lo < start )
        {
          char_lo = start;
          pos     = 0;
        }
        else
          pos = (FT_UInt)( char_lo - start );

        p       += offset + pos * 2;
        charcode = FT_PAD_FLOOR( charcode, 256 ) + char_lo;

        for ( ; pos < count; pos++, charcode++ )
        {
          idx = TT_NEXT_USHORT( p );

          if ( idx != 0 )
          {
            gindex = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
            if ( gindex != 0 )
            {
              result = charcode;
              goto Exit;
            }
          }
        }

        /* if unsuccessful, avoid `charcode' leaving */
        /* the current 256-character block           */
        if ( count )
          charcode--;
      }

      /* If `charcode' is <= 0xFF, retry with `charcode + 1'.      */
      /* Otherwise jump to the next 256-character block and retry. */
    Next_SubHeader:
      if ( charcode <= 0xFF )
        charcode++;
      else
        charcode = FT_PAD_FLOOR( charcode, 0x100 ) + 0x100;
    }

  Exit:
    *pcharcode = result;

    return gindex;
  }